

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O0

void __thiscall
solitaire::graphics::SDLGraphicsSystemWithLoadedTexture_renderTextureSuccessfully_Test::
SDLGraphicsSystemWithLoadedTexture_renderTextureSuccessfully_Test
          (SDLGraphicsSystemWithLoadedTexture_renderTextureSuccessfully_Test *this)

{
  SDLGraphicsSystemWithLoadedTexture_renderTextureSuccessfully_Test *this_local;
  
  SDLGraphicsSystemWithLoadedTexture::SDLGraphicsSystemWithLoadedTexture
            (&this->super_SDLGraphicsSystemWithLoadedTexture);
  (this->super_SDLGraphicsSystemWithLoadedTexture).super_SDLGraphicsSystemWithCreatedWindowTests.
  super_SDLGraphicsSystemTests.super_Test._vptr_Test =
       (_func_int **)
       &PTR__SDLGraphicsSystemWithLoadedTexture_renderTextureSuccessfully_Test_005064c8;
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemWithLoadedTexture, renderTextureSuccessfully) {
    EXPECT_CALL(*sdlMock,
        renderCopy(Pointer(rendererPtr), Pointer(texture0Ptr),
                   IsOptionalEq(srcRect), IsOptionalEq(dstRect))
    ).WillOnce(Return(success));

    system.renderTexture(textureId0, texturePosition, textureArea);
    expectQuitSystemWithLoadedTexture();
}